

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphical_model.h
# Opt level: O3

ssize_t __thiscall
merlin::graphical_model::read(graphical_model *this,int __fd,void *__buf,size_t __nbytes)

{
  vector<merlin::variable,std::allocator<merlin::variable>> *this_00;
  iterator __position;
  bool bVar1;
  int iVar2;
  long lVar3;
  size_t sVar4;
  undefined1 *extraout_RAX;
  undefined1 *puVar5;
  runtime_error *this_01;
  long lVar6;
  ulong uVar7;
  undefined4 in_register_00000034;
  istream *piVar8;
  size_type __n;
  long lVar9;
  ulong uVar10;
  size_t index;
  size_t ncliques;
  double fval;
  size_t nval;
  size_t csize;
  size_t nvar;
  string st;
  vector<merlin::factor,_std::allocator<merlin::factor>_> factors;
  vector<std::vector<merlin::variable,_std::allocator<merlin::variable>_>,_std::allocator<std::vector<merlin::variable,_std::allocator<merlin::variable>_>_>_>
  cliques;
  size_t v;
  vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> sets;
  vector<unsigned_long,_std::allocator<unsigned_long>_> dims;
  string err_msg;
  ulong local_158;
  size_type local_150;
  double local_140;
  ulong local_138;
  size_type local_130;
  size_type local_128;
  char local_11c;
  undefined1 *local_118;
  undefined8 local_110;
  undefined1 local_108 [16];
  vector<merlin::factor,_std::allocator<merlin::factor>_> local_f8;
  vector<std::vector<merlin::variable,_std::allocator<merlin::variable>_>,_std::allocator<std::vector<merlin::variable,_std::allocator<merlin::variable>_>_>_>
  local_e0;
  _func_int **local_c8;
  vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> local_c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  factor local_90;
  
  piVar8 = (istream *)CONCAT44(in_register_00000034,__fd);
  local_118 = local_108;
  local_110 = 0;
  local_108[0] = 0;
  std::operator>>(piVar8,(string *)&local_118);
  iVar2 = std::__cxx11::string::compare((char *)&local_118);
  if (iVar2 == 0) {
    bVar1 = true;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&local_118);
    if (iVar2 != 0) {
      local_90._vptr_factor =
           (_func_int **)
           ((long)&local_90.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data + 8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"Merlin only supports the UAI Markov or Bayes file format.","")
      ;
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,(string *)&local_90);
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar1 = false;
  }
  this->m_markov = bVar1;
  std::istream::_M_extract<unsigned_long>((ulong *)piVar8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_a8,local_128,(allocator_type *)&local_90);
  if (local_128 != 0) {
    uVar10 = 0;
    do {
      std::istream::_M_extract<unsigned_long>((ulong *)piVar8);
      uVar10 = uVar10 + 1;
    } while (uVar10 < local_128);
  }
  std::istream::_M_extract<unsigned_long>((ulong *)piVar8);
  std::
  vector<std::vector<merlin::variable,_std::allocator<merlin::variable>_>,_std::allocator<std::vector<merlin::variable,_std::allocator<merlin::variable>_>_>_>
  ::vector(&local_e0,local_150,(allocator_type *)&local_90);
  std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::vector
            (&local_c0,local_150,(allocator_type *)&local_90);
  if (local_150 == 0) {
    __n = 0;
  }
  else {
    uVar10 = 0;
    do {
      std::istream::_M_extract<unsigned_long>((ulong *)piVar8);
      std::vector<merlin::variable,_std::allocator<merlin::variable>_>::reserve
                (local_e0.
                 super__Vector_base<std::vector<merlin::variable,_std::allocator<merlin::variable>_>,_std::allocator<std::vector<merlin::variable,_std::allocator<merlin::variable>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar10,local_130);
      if (local_130 != 0) {
        uVar7 = 0;
        do {
          std::istream::_M_extract<unsigned_long>((ulong *)piVar8);
          local_90.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start[(long)local_c8];
          local_90._vptr_factor = local_c8;
          this_00 = (vector<merlin::variable,std::allocator<merlin::variable>> *)
                    (local_e0.
                     super__Vector_base<std::vector<merlin::variable,_std::allocator<merlin::variable>_>,_std::allocator<std::vector<merlin::variable,_std::allocator<merlin::variable>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar10);
          __position._M_current = *(variable **)(this_00 + 8);
          if (__position._M_current == *(variable **)(this_00 + 0x10)) {
            std::vector<merlin::variable,std::allocator<merlin::variable>>::
            _M_realloc_insert<merlin::variable_const&>(this_00,__position,(variable *)&local_90);
          }
          else {
            (__position._M_current)->m_label = (size_t)local_c8;
            (__position._M_current)->m_states =
                 (size_t)local_90.v_.m_v.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start;
            *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x10;
          }
          variable_set::operator|=
                    (local_c0.
                     super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar10,(variable *)&local_90);
          uVar7 = uVar7 + 1;
        } while (uVar7 < local_130);
      }
      uVar10 = uVar10 + 1;
      __n = local_150;
    } while (uVar10 < local_150);
  }
  std::vector<merlin::factor,_std::allocator<merlin::factor>_>::vector
            (&local_f8,__n,(allocator_type *)&local_90);
  if (local_150 != 0) {
    local_158 = 0;
    do {
      std::istream::_M_extract<unsigned_long>((ulong *)piVar8);
      lVar3 = (long)local_c0.
                    super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>.
                    _M_impl.super__Vector_impl_data._M_start[local_158].m_v.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_c0.
                    super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>.
                    _M_impl.super__Vector_impl_data._M_start[local_158].m_v.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
      if (lVar3 == 0) {
        lVar6 = 1;
      }
      else {
        lVar3 = lVar3 >> 3;
        lVar6 = 1;
        lVar9 = 0;
        do {
          lVar6 = lVar6 * local_c0.
                          super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>
                          ._M_impl.super__Vector_impl_data._M_start[local_158].m_d[lVar9];
          lVar9 = lVar9 + 1;
        } while (lVar3 + (ulong)(lVar3 == 0) != lVar9);
      }
      if (local_138 != lVar6 + (ulong)(lVar6 == 0)) {
        __assert_fail("nval == sets[i].num_states()",
                      "/workspace/llm4binary/github/license_c_cmakelists/radum2275[P]merlin/include/graphical_model.h"
                      ,0xb1,"void merlin::graphical_model::read(std::istream &, bool)");
      }
      factor::factor(&local_90,
                     local_c0.
                     super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>
                     ._M_impl.super__Vector_impl_data._M_start + local_158,0.0);
      factor::operator=(local_f8.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                        ._M_impl.super__Vector_impl_data._M_start + local_158,&local_90);
      factor::~factor(&local_90);
      if (this->m_markov == false) {
        local_f8.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
        super__Vector_impl_data._M_start[local_158].c_ =
             (int)local_e0.
                  super__Vector_base<std::vector<merlin::variable,_std::allocator<merlin::variable>_>,_std::allocator<std::vector<merlin::variable,_std::allocator<merlin::variable>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_158].
                  super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1].m_label;
      }
      convert_index::convert_index
                ((convert_index *)&local_90,
                 local_e0.
                 super__Vector_base<std::vector<merlin::variable,_std::allocator<merlin::variable>_>,_std::allocator<std::vector<merlin::variable,_std::allocator<merlin::variable>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + local_158,false,true);
      if (local_138 != 0) {
        index = 0;
        do {
          sVar4 = convert_index::convert((convert_index *)&local_90,index);
          std::istream::_M_extract<double>((double *)piVar8);
          local_11c = (char)__buf;
          if (local_11c != '\0') {
            if ((local_140 != 0.0) || (NAN(local_140))) {
              if ((local_140 == 1.0) && (!NAN(local_140))) {
                local_140 = 0.999999;
              }
            }
            else {
              local_140 = local_140 + 1e-06;
            }
          }
          local_f8.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
          super__Vector_impl_data._M_start[local_158].t_.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[sVar4] = local_140;
          index = index + 1;
        } while (index < local_138);
      }
      if (local_90.v_.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
        operator_delete(local_90.v_.m_dlocal.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish);
      }
      if (local_90.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish != (pointer)0x0) {
        operator_delete(local_90.v_.m_v.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish);
      }
      local_158 = local_158 + 1;
    } while (local_158 < local_150);
  }
  std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator=
            (&this->m_factors,&local_f8);
  fixup(this);
  std::vector<merlin::factor,_std::allocator<merlin::factor>_>::~vector(&local_f8);
  std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::~vector(&local_c0);
  std::
  vector<std::vector<merlin::variable,_std::allocator<merlin::variable>_>,_std::allocator<std::vector<merlin::variable,_std::allocator<merlin::variable>_>_>_>
  ::~vector(&local_e0);
  if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  puVar5 = local_108;
  if (local_118 != puVar5) {
    operator_delete(local_118);
    puVar5 = extraout_RAX;
  }
  return (ssize_t)puVar5;
}

Assistant:

void read(std::istream& is, bool positive_mode = false) {

		// Read the header
		size_t nvar, ncliques, csize, v, nval;
		std::string st;
		is >> st;
		if ( st.compare("MARKOV") == 0 ) {
			m_markov = true;
		} else if ( st.compare("BAYES") == 0 ) {
			m_markov = false;
		} else {
			std::string err_msg("Merlin only supports the UAI Markov or Bayes file format.");
			throw std::runtime_error(err_msg);
		}

		// Read the number of variables and their domains
		is >> nvar;
		std::vector<size_t> dims(nvar);
		for (size_t i = 0; i < nvar; i++)
			is >> dims[i];

		// Read the number of factors and their scopes (scope is a variable_set)
		is >> ncliques;
		std::vector<std::vector<variable> > cliques(ncliques);
		std::vector<variable_set> sets(ncliques);
		for (size_t i = 0; i < ncliques; i++) {
			is >> csize;
			cliques[i].reserve(csize);
			for (size_t j = 0; j < csize; j++) {
				is >> v;
				variable V(v, dims[v]);
				cliques[i].push_back(V);
				sets[i] |= V;
			}
		}

		// Read the factor tables (ensure conversion to ordered scopes)
		double fval;
		std::vector<factor> factors(ncliques);
		for (size_t i = 0; i < ncliques; i++) {
			is >> nval;
			assert(nval == sets[i].num_states());
			factors[i] = factor(sets[i], 0.0); // preallocate memory
			if (m_markov == false) { // for Bayes nets, last variable is the child
				factors[i].set_child(cliques[i].back().label());
			}
			convert_index ci(cliques[i], false, true); // convert from source order (littleEndian) to target order (bigEndian)
			for (size_t j = 0; j < nval; j++) {
				size_t k = ci.convert(j);	// get the index in the factor table
				is >> fval; // read the factor value;
				if (positive_mode) { // force positive values (> 0) if enabled
					if (fval == 0.0) {
						fval += MERLIN_EPSILON; // adjust slightly for numerical stability
					} else if (fval == 1.0) {
						fval -= MERLIN_EPSILON; // adjust slightly for numerical stability
					}
				}

				factors[i][k] = fval; // save the factor value into the table
			}
		}

		m_factors = factors;
		fixup();
	}